

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O2

void __thiscall mwheel::implementation::PluginUnloader::~PluginUnloader(PluginUnloader *this)

{
  pointer pfVar1;
  pointer this_00;
  
  pfVar1 = (this->m_callback).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_callback).
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pfVar1; this_00 = this_00 + 1
      ) {
    std::function<void_()>::operator()(this_00);
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->m_callback);
  return;
}

Assistant:

~PluginUnloader() {
    for (const auto &x : m_callback) {
      x();
    }
  }